

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O2

void __thiscall
s2builderutil::S2PolygonLayer::AppendEdgeLabels
          (S2PolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops)

{
  EdgeId *pEVar1;
  EdgeId *pEVar2;
  pointer pvVar3;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> loop_label_set_ids;
  LabelFetcher fetcher;
  int32 local_ac;
  pointer local_a8;
  pointer local_a0;
  _Vector_base<int,_std::allocator<int>_> local_98;
  _Vector_base<int,_std::allocator<int>_> local_78;
  LabelFetcher local_58;
  
  if (this->label_set_ids_ != (LabelSetIds *)0x0) {
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    S2Builder::Graph::LabelFetcher::LabelFetcher(&local_58,g,(this->options_).edge_type_);
    local_a8 = (edge_loops->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = (edge_loops->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar3 != local_a8;
        pvVar3 = pvVar3 + 1) {
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_78,
                 (long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
      pEVar1 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_a0 = pvVar3;
      for (pEVar2 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
        S2Builder::Graph::LabelFetcher::Fetch
                  (&local_58,*pEVar2,(vector<int,_std::allocator<int>_> *)&local_98);
        local_ac = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                             (this->label_set_lexicon_,
                              (vector<int,_std::allocator<int>_> *)&local_98);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&local_78,&local_ac);
      }
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)this->label_set_ids_,(vector<int,_std::allocator<int>_> *)&local_78);
      pvVar3 = local_a0;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_58.sibling_map_.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  }
  return;
}

Assistant:

void S2PolygonLayer::AppendEdgeLabels(
    const Graph& g,
    const vector<Graph::EdgeLoop>& edge_loops) {
  if (!label_set_ids_) return;

  vector<Label> labels;  // Temporary storage for labels.
  Graph::LabelFetcher fetcher(g, options_.edge_type());
  for (const auto& edge_loop : edge_loops) {
    vector<LabelSetId> loop_label_set_ids;
    loop_label_set_ids.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      fetcher.Fetch(edge_id, &labels);
      loop_label_set_ids.push_back(label_set_lexicon_->Add(labels));
    }
    label_set_ids_->push_back(std::move(loop_label_set_ids));
  }
}